

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void recalculate_it_envelope_node(IT_PLAYING_ENVELOPE *pe,IT_ENVELOPE *e)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = e->n_nodes - 1;
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
LAB_005858f2:
      pe->next_node = uVar1;
      return;
    }
    if (pe->tick <= (int)(uint)e->node_t[uVar2]) {
      uVar1 = (uint)uVar2;
      goto LAB_005858f2;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static void recalculate_it_envelope_node(IT_PLAYING_ENVELOPE *pe, IT_ENVELOPE *e)
{
	int envpos = pe->tick;
	unsigned int pt = e->n_nodes - 1;
	unsigned int i;
	for (i = 0; i < (unsigned int)(e->n_nodes - 1); ++i)
	{
		if (envpos <= e->node_t[i])
		{
			pt = i;
			break;
		}
	}
	pe->next_node = pt;
}